

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.h
# Opt level: O3

void __thiscall adios2::format::BufferSTL::~BufferSTL(BufferSTL *this)

{
  ~BufferSTL(this);
  operator_delete(this);
  return;
}

Assistant:

~BufferSTL() = default;